

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackIR.cpp
# Opt level: O2

void __thiscall wasm::StackIROptimizer::local2Stack(StackIROptimizer *this)

{
  Op OVar1;
  pointer ppSVar2;
  StackInst *inst;
  _Base_ptr p_Var3;
  Index IVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  undefined1 local_198 [8];
  LocalGraph localGraph;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  savedValues;
  LocalSet *set;
  key_type pLStack_60;
  Index null;
  LocalGet *get;
  LocalGet *pLStack_50;
  pointer local_48;
  uint local_34;
  
  LocalGraph::LocalGraph((LocalGraph *)local_198,this->func);
  LocalGraph::computeSetInfluences((LocalGraph *)local_198);
  set._4_4_ = 0xffffffff;
  local_48 = (pointer)0x0;
  savedValues.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  get = (LocalGet *)0x0;
  pLStack_50 = (LocalGet *)0x0;
  localGraph.SSAIndexes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  savedValues.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_34 = 0;
  do {
    ppSVar2 = (this->insts->
              super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->insts->
                      super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2 >> 3) <=
        (ulong)local_34) {
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)&localGraph.SSAIndexes._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&get);
      LocalGraph::~LocalGraph((LocalGraph *)local_198);
      return;
    }
    inst = ppSVar2[local_34];
    if (inst != (StackInst *)0x0) {
      IVar4 = getNumConsumedValues(this,inst);
      while (bVar10 = IVar4 != 0, IVar4 = IVar4 - 1, bVar10) {
        if (pLStack_50 == get) {
          __assert_fail("values.size() > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/StackIR.cpp"
                        ,0x98,"void wasm::StackIROptimizer::local2Stack()");
        }
        while (pLStack_50 = (LocalGet *)&pLStack_50[-1].field_0x14, *(int *)pLStack_50 != -1) {
          if (pLStack_50 == get) {
            __assert_fail("values.size() > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/StackIR.cpp"
                          ,0x9d,"void wasm::StackIROptimizer::local2Stack()");
          }
        }
      }
      OVar1 = inst->op;
      if (OVar1 < (TryEnd|BlockBegin)) {
        if ((0x18a4U >> (OVar1 & 0x1f) & 1) == 0) {
          if ((0x14aU >> (OVar1 & 0x1f) & 1) == 0) {
            if (OVar1 != Basic) goto LAB_009316cd;
          }
          else {
            std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         *)&localGraph.SSAIndexes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&get);
            if (pLStack_50 != get) {
              pLStack_50 = get;
            }
          }
        }
        else {
          if ((pointer)localGraph.SSAIndexes._M_t._M_impl.super__Rb_tree_header._M_node_count ==
              savedValues.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            __assert_fail("!savedValues.empty()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/StackIR.cpp"
                          ,0xaa,"void wasm::StackIROptimizer::local2Stack()");
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&get,
                     savedValues.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + -1);
          savedValues.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               savedValues.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + -1;
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&(savedValues.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        }
      }
      else {
LAB_009316cd:
        if (pLStack_50 != get) {
          pLStack_50 = get;
        }
      }
      uVar9 = (inst->type).id;
      if (uVar9 < 2) {
        if ((uVar9 == 0) && (inst->origin->_id == LocalSetId)) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&get,&local_34);
        }
      }
      else {
        pLStack_60 = (key_type)inst->origin;
        if ((((key_type)inst->origin)->super_SpecificExpression<(wasm::Expression::Id)8>).
            super_Expression._id != LocalGetId) {
          pLStack_60 = (key_type)0x0;
        }
        if ((pLStack_60 != (key_type)0x0) && ((long)pLStack_50 - (long)get != 0)) {
          uVar9 = (ulong)((long)pLStack_50 - (long)get) >> 2;
          do {
            uVar9 = (ulong)((int)uVar9 - 1);
            uVar8 = (ulong)(&(get->super_SpecificExpression<(wasm::Expression::Id)8>).
                             super_Expression._id)[uVar9];
            if (uVar8 == 0xffffffff) break;
            savedValues.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)Expression::cast<wasm::LocalSet>
                                    ((this->insts->
                                     super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>
                                     )._M_impl.super__Vector_impl_data._M_start[uVar8]->origin);
            if (((LocalSet *)
                savedValues.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage)->index == pLStack_60->index) {
              pmVar5 = std::__detail::
                       _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)local_198,&stack0xffffffffffffffa0);
              p_Var3 = (_Base_ptr)
                       (pmVar5->
                       super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                       ).flexible._M_t._M_impl.super__Rb_tree_header._M_node_count;
              p_Var7 = p_Var3;
              if (p_Var3 == (_Base_ptr)0x0) {
                p_Var7 = (_Base_ptr)
                         (pmVar5->
                         super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                         ).fixed.super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used;
              }
              if (p_Var7 == (_Base_ptr)0x1) {
                p_Var7 = p_Var3;
                if (p_Var3 != (_Base_ptr)0x0) {
                  p_Var7 = (pmVar5->
                           super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                           ).flexible._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                }
                p_Var7 = p_Var7 + 1;
                if (p_Var3 == (_Base_ptr)0x0) {
                  p_Var7 = (_Base_ptr)
                           &(pmVar5->
                            super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                            ).fixed.super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage;
                }
                if ((*(pointer *)p_Var7 ==
                     savedValues.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage) &&
                   (pmVar6 = std::__detail::
                             _Map_base<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             ::operator[]((_Map_base<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                           *)&localGraph.getInfluences._M_h._M_single_bucket,
                                          (key_type *)
                                          &savedValues.
                                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage),
                   (pmVar6->_M_h)._M_element_count == 1)) {
                  if ((key_type)(pmVar6->_M_h)._M_before_begin._M_nxt[1]._M_nxt != pLStack_60) {
                    __assert_fail("*setInfluences.begin() == get",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/StackIR.cpp"
                                  ,199,"void wasm::StackIROptimizer::local2Stack()");
                  }
                  (this->insts->
                  super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)._M_impl
                  .super__Vector_impl_data._M_start[uVar8] = (StackInst *)0x0;
                  (this->insts->
                  super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)._M_impl
                  .super__Vector_impl_data._M_start[local_34] = (StackInst *)0x0;
                  (&(get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression._id)
                  [uVar9] = ~InvalidId;
                  goto LAB_009316bb;
                }
              }
            }
          } while (uVar9 != 0);
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&get,
                   (value_type_conflict2 *)((long)&set + 4));
      }
    }
LAB_009316bb:
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

void local2Stack() {
    // We use the localGraph to tell us if a get-set pair is indeed
    // a set that is read by that get, and only that get. Note that we run
    // this on the Binaryen IR, so we are assuming that no previous opt
    // has changed the interaction of local operations.
    // TODO: we can do this a lot faster, as we just care about linear
    //       control flow.
    LocalGraph localGraph(func);
    localGraph.computeSetInfluences();
    // We maintain a stack of relevant values. This contains:
    //  * a null for each actual value that the value stack would have
    //  * an index of each LocalSet that *could* be on the value
    //    stack at that location.
    const Index null = -1;
    std::vector<Index> values;
    // We also maintain a stack of values vectors for control flow,
    // saving the stack as we enter and restoring it when we exit.
    std::vector<std::vector<Index>> savedValues;
#ifdef STACK_OPT_DEBUG
    std::cout << "func: " << func->name << '\n' << insts << '\n';
#endif
    for (Index i = 0; i < insts.size(); i++) {
      auto* inst = insts[i];
      if (!inst) {
        continue;
      }
      // First, consume values from the stack as required.
      auto consumed = getNumConsumedValues(inst);
#ifdef STACK_OPT_DEBUG
      std::cout << "  " << i << " : " << *inst << ", " << values.size()
                << " on stack, will consume " << consumed << "\n    ";
      for (auto s : values)
        std::cout << s << ' ';
      std::cout << '\n';
#endif
      // TODO: currently we run dce before this, but if we didn't, we'd need
      //       to handle unreachable code here - it's ok to pop multiple values
      //       there even if the stack is at size 0.
      while (consumed > 0) {
        assert(values.size() > 0);
        // Whenever we hit a possible stack value, kill it - it would
        // be consumed here, so we can never optimize to it.
        while (values.back() != null) {
          values.pop_back();
          assert(values.size() > 0);
        }
        // Finally, consume the actual value that is consumed here.
        values.pop_back();
        consumed--;
      }
      // After consuming, we can see what to do with this. First, handle
      // control flow.
      if (isControlFlowBegin(inst)) {
        // Save the stack for when we end this control flow.
        savedValues.push_back(values); // TODO: optimize copies
        values.clear();
      } else if (isControlFlowEnd(inst)) {
        assert(!savedValues.empty());
        values = savedValues.back();
        savedValues.pop_back();
      } else if (isControlFlow(inst)) {
        // Otherwise, in the middle of control flow, just clear it
        values.clear();
      }
      // This is something we should handle, look into it.
      if (inst->type.isConcrete()) {
        bool optimized = false;
        if (auto* get = inst->origin->dynCast<LocalGet>()) {
          // This is a potential optimization opportunity! See if we
          // can reach the set.
          if (values.size() > 0) {
            Index j = values.size() - 1;
            while (1) {
              // If there's an actual value in the way, we've failed.
              auto index = values[j];
              if (index == null) {
                break;
              }
              auto* set = insts[index]->origin->cast<LocalSet>();
              if (set->index == get->index) {
                // This might be a proper set-get pair, where the set is
                // used by this get and nothing else, check that.
                auto& sets = localGraph.getSetses[get];
                if (sets.size() == 1 && *sets.begin() == set) {
                  auto& setInfluences = localGraph.setInfluences[set];
                  if (setInfluences.size() == 1) {
                    assert(*setInfluences.begin() == get);
                    // Do it! The set and the get can go away, the proper
                    // value is on the stack.
#ifdef STACK_OPT_DEBUG
                    std::cout << "  stackify the get\n";
#endif
                    insts[index] = nullptr;
                    insts[i] = nullptr;
                    // Continuing on from here, replace this on the stack
                    // with a null, representing a regular value. We
                    // keep possible values above us active - they may
                    // be optimized later, as they would be pushed after
                    // us, and used before us, so there is no conflict.
                    values[j] = null;
                    optimized = true;
                    break;
                  }
                }
              }
              // We failed here. Can we look some more?
              if (j == 0) {
                break;
              }
              j--;
            }
          }
        }
        if (!optimized) {
          // This is an actual regular value on the value stack.
          values.push_back(null);
        }
      } else if (inst->origin->is<LocalSet>() && inst->type == Type::none) {
        // This set is potentially optimizable later, add to stack.
        values.push_back(i);
      }
    }
  }